

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>::~Stack
          (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *this)

{
  pair<Kernel::TermSpec,_Kernel::RealConstantType> *ppVar1;
  ulong uVar2;
  pair<Kernel::TermSpec,_Kernel::RealConstantType> *ppVar3;
  
  for (ppVar3 = this->_cursor; ppVar1 = this->_stack, ppVar3 != ppVar1; ppVar3 = ppVar3 + -1) {
    mpz_clear(ppVar3[-1].second.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&ppVar3[-1].second);
  }
  if (ppVar1 != (pair<Kernel::TermSpec,_Kernel::RealConstantType> *)0x0) {
    uVar2 = this->_capacity * 0x30;
    if (uVar2 == 0) {
      (ppVar1->first).term._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppVar1;
    }
    else if (uVar2 < 0x11) {
      (ppVar1->first).term._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppVar1;
    }
    else if (uVar2 < 0x19) {
      (ppVar1->first).term._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppVar1;
    }
    else if (uVar2 < 0x21) {
      (ppVar1->first).term._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppVar1;
    }
    else if (uVar2 < 0x31) {
      (ppVar1->first).term._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppVar1;
    }
    else {
      if (0x40 < uVar2) {
        operator_delete(ppVar1,0x10);
        return;
      }
      (ppVar1->first).term._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppVar1;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }